

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O1

void Rml::StringUtilities::ExpandString(StringList *string_list,String *string,char delimiter)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  byte *pbVar9;
  byte *pbVar10;
  StringView string_00;
  char *start_ptr;
  byte *local_68;
  String local_60;
  StringView local_40;
  
  pbVar9 = (byte *)(string->_M_dataplus)._M_p;
  local_68 = (byte *)0x0;
  pcVar7 = (char *)string->_M_string_length;
  if (pcVar7 == (char *)0x0) {
    lVar3 = 0;
  }
  else {
    pcVar8 = (char *)0x0;
    lVar3 = 0;
    do {
      lVar3 = lVar3 + (ulong)(pbVar9[(long)pcVar8] == delimiter);
      pcVar8 = pcVar8 + 1;
    } while (pcVar7 != pcVar8);
  }
  if (lVar3 == 0) {
    StringView::StringView(&local_40,string);
    string_00.p_end = pcVar7;
    string_00.p_begin = local_40.p_end;
    StripWhitespace_abi_cxx11_(&local_60,(StringUtilities *)local_40.p_begin,string_00);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)string_list,
               &local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)string_list,
              lVar3 + ((long)(string_list->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(string_list->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
    bVar1 = *pbVar9;
    pbVar10 = pbVar9;
    if (bVar1 != 0) {
      bVar2 = true;
      uVar5 = 0;
      do {
        uVar6 = (ulong)bVar1;
        bVar4 = (byte)uVar5;
        if (((!bVar2) || (bVar4 != 0)) || ((bVar1 != 0x22 && (bVar1 != 0x27)))) {
          if ((bVar1 != bVar4) || (pbVar9[-1] == 0x5c)) {
            if (bVar1 == delimiter && bVar4 == 0) {
              if (local_68 == (byte *)0x0) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)string_list);
              }
              else {
                local_60._M_dataplus._M_p = (pointer)(pbVar10 + 1);
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char_const*&,char_const*>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           string_list,(char **)&local_68,(char **)&local_60);
              }
              local_68 = (byte *)0x0;
              bVar2 = true;
            }
            else if (((0x20 < bVar1) || ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0)) || (bVar4 != 0)
                    ) {
              if (local_68 == (byte *)0x0) {
                local_68 = pbVar9;
              }
              bVar2 = false;
              uVar6 = uVar5;
              pbVar10 = pbVar9;
              goto LAB_00267f21;
            }
          }
          uVar6 = 0;
        }
LAB_00267f21:
        bVar1 = pbVar9[1];
        pbVar9 = pbVar9 + 1;
        uVar5 = uVar6;
      } while (bVar1 != 0);
    }
    if (local_68 != (byte *)0x0) {
      local_60._M_dataplus._M_p = (pointer)(pbVar10 + 1);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&,char_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)string_list,
                 (char **)&local_68,(char **)&local_60);
    }
  }
  return;
}

Assistant:

void StringUtilities::ExpandString(StringList& string_list, const String& string, const char delimiter)
{
	char quote = 0;
	bool last_char_delimiter = true;
	const char* ptr = string.c_str();
	const char* start_ptr = nullptr;
	const char* end_ptr = ptr;

	size_t num_delimiter_values = std::count(string.begin(), string.end(), delimiter);
	if (num_delimiter_values == 0)
	{
		string_list.push_back(StripWhitespace(string));
		return;
	}
	string_list.reserve(string_list.size() + num_delimiter_values + 1);

	while (*ptr)
	{
		// Switch into quote mode if the last char was a delimeter ( excluding whitespace )
		// and we're not already in quote mode
		if (last_char_delimiter && !quote && (*ptr == '"' || *ptr == '\''))
		{
			quote = *ptr;
		}
		// Switch out of quote mode if we encounter a quote that hasn't been escaped
		else if (*ptr == quote && *(ptr - 1) != '\\')
		{
			quote = 0;
		}
		// If we encounter a delimiter while not in quote mode, add the item to the list
		else if (*ptr == delimiter && !quote)
		{
			if (start_ptr)
				string_list.emplace_back(start_ptr, end_ptr + 1);
			else
				string_list.emplace_back();
			last_char_delimiter = true;
			start_ptr = nullptr;
		}
		// Otherwise if its not white space or we're in quote mode, advance the pointers
		else if (!IsWhitespace(*ptr) || quote)
		{
			if (!start_ptr)
				start_ptr = ptr;
			end_ptr = ptr;
			last_char_delimiter = false;
		}

		ptr++;
	}

	// If there's data pending, add it.
	if (start_ptr)
		string_list.emplace_back(start_ptr, end_ptr + 1);
}